

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserBase.cpp
# Opt level: O0

Token __thiscall slang::parsing::ParserBase::peek(ParserBase *this)

{
  bool bVar1;
  undefined8 *puVar2;
  long in_RDI;
  Window *in_stack_00000040;
  
  bVar1 = Token::operator_cast_to_bool((Token *)0x61718f);
  if (!bVar1) {
    if (*(ulong *)(in_RDI + 0x40) <= *(ulong *)(in_RDI + 0x38)) {
      Window::addNew(in_stack_00000040);
    }
    puVar2 = (undefined8 *)(*(long *)(in_RDI + 0x10) + *(long *)(in_RDI + 0x38) * 0x10);
    *(undefined8 *)(in_RDI + 0x18) = *puVar2;
    *(undefined8 *)(in_RDI + 0x20) = puVar2[1];
  }
  return *(Token *)(in_RDI + 0x18);
}

Assistant:

Token ParserBase::peek() {
    if (!window.currentToken) {
        if (window.currentOffset >= window.count)
            window.addNew();
        window.currentToken = window.buffer[window.currentOffset];
    }
    SLANG_ASSERT(window.currentToken);
    return window.currentToken;
}